

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char *params_2,int *params_3,char (*params_4) [3],String *params_5)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff70;
  undefined1 local_81;
  undefined1 local_80 [16];
  ArrayPtr<const_char> local_70;
  kj local_60 [8];
  undefined8 local_58;
  ArrayPtr<const_char> local_50;
  CappedArray<char,_14UL> local_40;
  
  local_60[0] = *this;
  local_58 = *(undefined8 *)(this + 8);
  local_70 = toCharSequence<char_const*&>((char **)params);
  local_81 = *(undefined1 *)params_1;
  toCharSequence<int&>(&local_40,(kj *)params_2,(int *)local_70.size_);
  local_80 = (undefined1  [16])toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  pcVar1 = *(char **)(params_4[2] + 2);
  local_50.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_50.ptr = *(char **)params_4;
  }
  local_50.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_50.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)local_60,(Repeat<char> *)&local_70,
             (ArrayPtr<const_char> *)&local_81,(FixedArray<char,_1UL> *)&local_40,
             (CappedArray<char,_14UL> *)local_80,&local_50,in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}